

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O1

int agentfwd_accepting(Plug *p,accept_fn_t constructor,accept_ctx_t ctx)

{
  Plug *in_RAX;
  Channel *pfchan;
  Socket *s;
  char *pcVar1;
  SshChannel *sc;
  Plug *plug;
  Plug *local_38;
  
  local_38 = in_RAX;
  pfchan = portfwd_raw_new((ConnectionLayer *)p[-2].vt,&local_38,false);
  s = (*constructor)((accept_ctx_t)ctx.p,local_38);
  pcVar1 = (*s->vt->socket_error)(s);
  if (pcVar1 == (char *)0x0) {
    sc = (SshChannel *)(**(code **)((p[-2].vt)->closing + 0x28))(p[-2].vt,pfchan);
    portfwd_raw_setup(pfchan,s,sc);
  }
  else {
    portfwd_raw_free(pfchan);
  }
  return (uint)(pcVar1 != (char *)0x0);
}

Assistant:

static int agentfwd_accepting(
    Plug *p, accept_fn_t constructor, accept_ctx_t ctx)
{
    agentfwd *agent = container_of(p, agentfwd, plug);
    Plug *plug;
    Channel *chan;
    Socket *s;
    const char *err;

    chan = portfwd_raw_new(agent->cl, &plug, false);
    s = constructor(ctx, plug);
    if ((err = sk_socket_error(s)) != NULL) {
        portfwd_raw_free(chan);
        return 1;
    }
    portfwd_raw_setup(chan, s, ssh_serverside_agent_open(agent->cl, chan));

    return 0;
}